

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O1

void fti2c_(int *A1,char *A2,int *A3,size_t C2)

{
  int iVar1;
  char *s;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char str [21];
  char acStack_48 [32];
  
  iVar1 = *A1;
  sVar4 = gMinStrLen;
  if (gMinStrLen <= C2) {
    sVar4 = C2;
  }
  s = (char *)malloc(sVar4 + 1);
  s[C2] = '\0';
  pcVar3 = A2;
  memcpy(s,A2,C2);
  kill_trailing(s,(char)pcVar3);
  ffi2c((long)iVar1,s,A3);
  snprintf(acStack_48,0x15,"%20s",s);
  strcpy(s,acStack_48);
  if (s != (char *)0x0) {
    sVar2 = strlen(s);
    if (C2 <= sVar2) {
      sVar2 = C2;
    }
    memcpy(A2,s,sVar2);
    sVar2 = strlen(s);
    if (sVar2 <= C2 && C2 - sVar2 != 0) {
      memset(A2 + sVar2,0x20,C2 - sVar2);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTI2C,fti2c)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),LONG,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(LONG,1)
   QCF(PSTRING,2)
   QCF(PINT,3)
   char str[21];

   ffi2c( TCF(fti2c,LONG,1,0) 
          TCF(fti2c,PSTRING,2,1) 
          TCF(fti2c,PINT,3,1) );

   snprintf(str,21,"%20s",B2);
   strcpy(B2,str);

   RCF(LONG,1)
   RCF(PSTRING,2)
   RCF(PINT,3)
}